

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

Am_Wrapper * __thiscall Am_Connection_Data::Make_Unique(Am_Connection_Data *this)

{
  uint uVar1;
  Am_Connection_Data *this_00;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  this_00 = this;
  if (uVar1 != 1) {
    (this->super_Am_Wrapper).refs = uVar1 - 1;
    this_00 = (Am_Connection_Data *)operator_new(0x48);
    Am_Connection_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

Am_Connection_Data::Am_Connection_Data(void)
{
  m_socket = 1;             // Stdout on unix, shouldn't be used anyway
  connected = false;        // Connection flag: Am I Connected?
  waiting = false;          // Am I waiting to accept an incoming conn?
  Value_Queue.Make_Empty(); // Processed incoming data (None yet)
  List_Queue = nullptr;        // Lists being read in
  Object_Queue = nullptr;      // Objects being read in
}